

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O3

void __thiscall ODDLParser::DDLNode::~DDLNode(DDLNode *this)

{
  Property *this_00;
  Value *this_01;
  Reference *this_02;
  DataArrayList *this_03;
  DDLNode *this_04;
  pointer pcVar1;
  pointer ppDVar2;
  ulong uVar3;
  
  this_00 = this->m_properties;
  if (this_00 != (Property *)0x0) {
    Property::~Property(this_00);
  }
  operator_delete(this_00);
  this_01 = this->m_value;
  if (this_01 != (Value *)0x0) {
    Value::~Value(this_01);
  }
  operator_delete(this_01);
  this_02 = this->m_references;
  if (this_02 != (Reference *)0x0) {
    Reference::~Reference(this_02);
    operator_delete(this_02);
  }
  this_03 = this->m_dtArrayList;
  if (this_03 != (DataArrayList *)0x0) {
    DataArrayList::~DataArrayList(this_03);
  }
  operator_delete(this_03);
  this->m_dtArrayList = (DataArrayList *)0x0;
  if (*(DDLNode **)(s_allocatedNodes + this->m_idx * 8) == this) {
    *(undefined8 *)(s_allocatedNodes + this->m_idx * 8) = 0;
  }
  ppDVar2 = (this->m_children).
            super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_children).
      super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar2) {
    uVar3 = 0;
    do {
      this_04 = ppDVar2[uVar3];
      if (this_04 != (DDLNode *)0x0) {
        ~DDLNode(this_04);
      }
      operator_delete(this_04);
      uVar3 = uVar3 + 1;
      ppDVar2 = (this->m_children).
                super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_children).
                                   super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar2 >> 3))
    ;
  }
  if (ppDVar2 != (pointer)0x0) {
    operator_delete(ppDVar2);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_type)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_type).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

DDLNode::~DDLNode() {
    delete m_properties;
    delete m_value;
    releaseReferencedNames( m_references );

    delete m_dtArrayList;
    m_dtArrayList = ddl_nullptr;
    if( s_allocatedNodes[ m_idx ] == this ) {
        s_allocatedNodes[ m_idx ] = ddl_nullptr;
    }
    for ( size_t i = 0; i<m_children.size(); i++ ){
        delete m_children[ i ];
    }
}